

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::ScopePool::~ScopePool(ScopePool *this)

{
  cmDeleteAll<std::vector<cmFileLock*,std::allocator<cmFileLock*>>>(&this->Locks);
  std::_Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>::~_Vector_base
            ((_Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_> *)this);
  return;
}

Assistant:

cmFileLockPool::ScopePool::~ScopePool()
{
  cmDeleteAll(this->Locks);
}